

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

int Sfm_TimEvalRemapping
              (Sfm_Tim_t *p,Vec_Int_t *vFanins,Vec_Int_t *vMap,Mio_Gate_t *pGate1,char *pFans1,
              Mio_Gate_t *pGate2,char *pFans2)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Mio_Gate_t *pTimeOut;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  int *pTimesIn2 [6];
  int *pTimesIn1 [6];
  undefined8 local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98 [6];
  
  pTimeOut = pGate1;
  uVar3 = Mio_GateReadPinNum(pGate1);
  if (0 < (int)uVar3) {
    pTimeOut = (Mio_Gate_t *)0x0;
    do {
      cVar1 = pFans1[(long)pTimeOut];
      if ((cVar1 < '\0') || (vFanins->nSize <= (int)cVar1)) goto LAB_004c6343;
      iVar2 = vFanins->pArray[(uint)(int)cVar1];
      if (((long)iVar2 < 0) || (vMap->nSize <= iVar2)) goto LAB_004c6343;
      uVar6 = vMap->pArray[iVar2];
      if ((int)uVar6 < 0) goto LAB_004c6381;
      if ((p->vTimArrs).nSize <= (int)(uVar6 * 2)) goto LAB_004c6362;
      *(int **)(&stack0xffffffffffffff98 + (long)pTimeOut * 8) =
           (p->vTimArrs).pArray + (ulong)uVar6 * 2;
      pTimeOut = (Mio_Gate_t *)((long)&pTimeOut->pName + 1);
    } while ((Mio_Gate_t *)(ulong)uVar3 != pTimeOut);
  }
  Sfm_TimGateArrival((Sfm_Tim_t *)pGate1,(Mio_Gate_t *)&stack0xffffffffffffff98,(int **)&local_a8,
                     (int *)pTimeOut);
  if (pGate2 != (Mio_Gate_t *)0x0) {
    uVar3 = Mio_GateReadPinNum(pGate2);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        uVar6 = (uint)pFans2[uVar4];
        piVar5 = (int *)&local_a8;
        if (uVar6 != 0x10) {
          if ((pFans2[uVar4] < '\0') || (vFanins->nSize <= (int)uVar6)) {
LAB_004c6343:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = vFanins->pArray[uVar6];
          if (((long)iVar2 < 0) || (vMap->nSize <= iVar2)) goto LAB_004c6343;
          uVar6 = vMap->pArray[iVar2];
          if ((int)uVar6 < 0) {
LAB_004c6381:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          if ((p->vTimArrs).nSize <= (int)(uVar6 * 2)) {
LAB_004c6362:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar5 = (p->vTimArrs).pArray + (ulong)uVar6 * 2;
        }
        local_98[uVar4] = piVar5;
        uVar4 = uVar4 + 1;
        pTimeOut = (Mio_Gate_t *)pFans2;
      } while (uVar3 != uVar4);
    }
    Sfm_TimGateArrival((Sfm_Tim_t *)pGate2,(Mio_Gate_t *)local_98,(int **)&local_a0,(int *)pTimeOut)
    ;
    local_a8._0_4_ = local_a0;
    local_a8._4_4_ = local_9c;
  }
  if (local_a8._4_4_ < (int)local_a8) {
    local_a8._4_4_ = (int)local_a8;
  }
  return local_a8._4_4_;
}

Assistant:

int Sfm_TimEvalRemapping( Sfm_Tim_t * p, Vec_Int_t * vFanins, Vec_Int_t * vMap, Mio_Gate_t * pGate1, char * pFans1, Mio_Gate_t * pGate2, char * pFans2 )
{
    int TimeOut[2][2];
    int * pTimesIn1[6], * pTimesIn2[6];
    int i, nFanins1, nFanins2;
    // process the first gate
    nFanins1 = Mio_GateReadPinNum( pGate1 );
    for ( i = 0; i < nFanins1; i++ )
        pTimesIn1[i] = Sfm_TimArrId( p, Vec_IntEntry(vMap, Vec_IntEntry(vFanins, (int)pFans1[i])) );
    Sfm_TimGateArrival( p, pGate1, pTimesIn1, TimeOut[0] );
    if ( pGate2 == NULL )
        return Abc_MaxInt(TimeOut[0][0], TimeOut[0][1]);
    // process the second gate
    nFanins2 = Mio_GateReadPinNum( pGate2 );
    for ( i = 0; i < nFanins2; i++ )
        if ( (int)pFans2[i] == 16 )
            pTimesIn2[i] = TimeOut[0];
        else
            pTimesIn2[i] = Sfm_TimArrId( p, Vec_IntEntry(vMap, Vec_IntEntry(vFanins, (int)pFans2[i])) );
    Sfm_TimGateArrival( p, pGate2, pTimesIn2, TimeOut[1] );
    return Abc_MaxInt(TimeOut[1][0], TimeOut[1][1]);
}